

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_tex.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdVtxBeta::emulate_mthd(MthdVtxBeta *this)

{
  uint32_t *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.access;
  lVar5 = 0x30;
  for (iVar6 = 0;
      (lVar5 != 0x10 &&
      (iVar3 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914,
      iVar6 + iVar3 * 2 != 9 || (uVar2 & 0xf000) != 0xe000)); iVar6 = iVar6 + 1) {
    uVar4 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << ((byte)lVar5 & 0x3f))
                  >> 0x20);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_beta[iVar6 + iVar3 * 2] =
         ((int)uVar4 >> 0x1f) * -0x1000000 + (uVar4 >> 8 & 0xff8000) + 0x4000;
    lVar5 = lVar5 + -0x10;
  }
  if ((uVar2 >> 0xc & 0x1f) - 0x1d < 2) {
    puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid;
    *puVar1 = *puVar1 | 1 << ((this->super_SingleMthdTest).super_MthdTest.field_0x25914 + 0xc & 0x1f
                             );
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rclass = extr(exp.access, 12, 5);
		for (int j = 0; j < 2; j++) {
			int vid = idx * 2 + j;
			if (vid == 9 && (rclass & 0xf) == 0xe)
				break;
			uint32_t beta = extr(val, j*16, 16);
			beta &= 0xff80;
			beta <<= 8;
			beta |= 0x4000;
			if (beta & 1 << 23)
				beta |= 1 << 24;
			exp.vtx_beta[vid] = beta;
		}
		if (rclass == 0x1d || rclass == 0x1e)
			exp.valid[0] |= 1 << (12 + idx);
	}